

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void set_min_size_cb(Fl_Button *param_1,void *v)

{
  bool bVar1;
  Fl_Widget_Type *pFVar2;
  int iVar3;
  Fl_Type *pFVar4;
  
  if ((char *)v != "LOAD") {
    if (Fl_Type::first == (Fl_Type *)0x0) {
      propagate_load(&the_panel->super_Fl_Group,"LOAD");
      return;
    }
    bVar1 = false;
    pFVar4 = Fl_Type::first;
    do {
      if (pFVar4->selected != '\0') {
        iVar3 = (*pFVar4->_vptr_Fl_Type[0x21])(pFVar4);
        if (iVar3 != 0) {
          iVar3 = current_widget->o->h_;
          pFVar2 = current_widget;
          pFVar2[1].super_Fl_Type.level = current_widget->o->w_;
          *(int *)&pFVar2[1].super_Fl_Type.field_0x4c = iVar3;
          bVar1 = true;
        }
      }
      pFVar4 = pFVar4->next;
    } while (pFVar4 != (Fl_Type *)0x0);
    propagate_load(&the_panel->super_Fl_Group,"LOAD");
    if (bVar1) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void set_min_size_cb(Fl_Button*, void* v) {
  if (v == LOAD) {
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        Fl_Window_Type *win = (Fl_Window_Type*)current_widget;
        win->sr_min_w = win->o->w();
        win->sr_min_h = win->o->h();
        mod = 1;
      }
    }
    propagate_load(the_panel, LOAD);
    if (mod) set_modflag(1);
  }
}